

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

bool __thiscall
JsrtDebuggerStackFrame::Evaluate
          (JsrtDebuggerStackFrame *this,ScriptContext *scriptContext,char16 *source,int sourceLength
          ,bool isLibraryCode,bool forceSetValueProp,DynamicObject **evalResult)

{
  ScriptEntryExitRecord *pSVar1;
  RecyclableObject *aValue;
  JsrtDebuggerObjectsManager *debuggerObjectsManager;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  charcount_t cVar5;
  BOOL BVar6;
  undefined4 extraout_var;
  Memory *this_00;
  undefined4 *puVar7;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *this_01;
  IDiagObjectModelDisplay *pIVar8;
  JsrtDebuggerObjectBase *pJVar9;
  undefined4 extraout_var_00;
  DynamicObject *pDVar10;
  RecyclableObject *this_02;
  ExceptionType EVar11;
  void *unaff_retaddr;
  undefined1 auStack_f8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_b8 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord *pSStack_60;
  uint local_54;
  AutoNestedHandledExceptionType local_3c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  ScriptContext *scriptContext_00;
  
  *evalResult = (DynamicObject *)0x0;
  if (this->stackFrame != (DiagStackFrame *)0x0) {
    __enterScriptObject.library._0_4_ = -1;
    local_54 = local_54 & 0xffffff00;
    iVar4 = (*this->stackFrame->_vptr_DiagStackFrame[10])();
    scriptContext_00 = (ScriptContext *)CONCAT44(extraout_var,iVar4);
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_3c,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                        ExceptionType_OutOfMemory);
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_b8,scriptContext_00,(ScriptEntryExitRecord *)auStack_f8,
               unaff_retaddr,&stack0x00000000,false,false,false);
    Js::ScriptContext::OnScriptStart(scriptContext_00,false,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_b8);
    pSVar1 = scriptContext_00->threadContext->entryExitRecord;
    *(byte *)pSVar1 = *(byte *)pSVar1 | 1;
    Js::DiagStackFrame::EvaluateImmediate
              (this->stackFrame,source,sourceLength,(uint)isLibraryCode,
               (ResolvedObject *)&__enterScriptObject.library);
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_b8);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_3c);
    aValue = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    if (aValue == (RecyclableObject *)0x0) {
      return false;
    }
    cVar5 = Js::JavascriptString::GetBufferLength(source);
    this_00 = (Memory *)
              JsrtDebuggerObjectsManager::GetDebugObjectArena(this->debuggerObjectsManager);
    pSStack_60 = (ScriptEntryExitRecord *)
                 Memory::AllocateArray<Memory::ArenaAllocator,char16_t,true>
                           (this_00,(ArenaAllocator *)Memory::ArenaAllocator::NoThrowAlloc,0,
                            (ulong)(cVar5 + 1));
    if (pSStack_60 == (ScriptEntryExitRecord *)0x0) {
      pSStack_60 = (ScriptEntryExitRecord *)0xe8b76e;
    }
    else {
      wcscpy_s((WCHAR *)pSStack_60,(ulong)(cVar5 + 1),source);
    }
    if (aValue == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_0039b9a0;
      *puVar7 = 0;
    }
    bVar3 = Js::TaggedInt::Is(aValue);
    if (bVar3) {
      EVar11 = ExceptionType_StackOverflow|ExceptionType_OutOfMemory;
    }
    else if ((ulong)aValue >> 0x32 == 0) {
      this_02 = Js::UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this_02 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_0039b9a0;
        *puVar7 = 0;
      }
      EVar11 = ((this_02->type).ptr)->typeId;
      if ((0x57 < (int)EVar11) && (BVar6 = Js::RecyclableObject::IsExternal(this_02), BVar6 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_0039b9a0;
        *puVar7 = 0;
      }
    }
    else {
      EVar11 = ExceptionType_JavascriptException;
    }
    debuggerObjectsManager = this->debuggerObjectsManager;
    __entryExitRecord.next = pSStack_60;
    __entryExitRecord._52_4_ = local_54;
    auStack_f8._4_4_ = __enterScriptObject.library._4_4_;
    auStack_f8._0_4_ = (PropertyId)__enterScriptObject.library;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord._0_8_ = scriptContext_00;
    __entryExitRecord.frameIdOfScriptExitFunction = aValue;
    __entryExitRecord.handledExceptionType = EVar11;
    local_b8 = (undefined1  [8])Js::ResolvedObject::GetObjectDisplay((ResolvedObject *)auStack_f8);
    this_01 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                        ((BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> *)
                         local_b8);
    pIVar8 = Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference(this_01);
    if (pIVar8 != (IDiagObjectModelDisplay *)0x0) {
      pJVar9 = JsrtDebuggerObjectProperty::Make
                         (debuggerObjectsManager,
                          (WeakArenaReference<Js::IDiagObjectModelDisplay> *)local_b8);
      iVar4 = (*pJVar9->_vptr_JsrtDebuggerObjectBase[2])
                        (pJVar9,__entryExitRecord._0_8_,(ulong)forceSetValueProp);
      if ((Var)CONCAT44(extraout_var_00,iVar4) == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.h"
                           ,0x2a,"(object != nullptr)","object != nullptr");
        if (!bVar3) {
LAB_0039b9a0:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      pDVar10 = (DynamicObject *)
                Js::CrossSite::MarshalVar(scriptContext,(Var)CONCAT44(extraout_var_00,iVar4),false);
      *evalResult = pDVar10;
      local_b8 = (undefined1  [8])0x0;
    }
    AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::
    ~AutoPtr((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
              *)local_b8);
  }
  return false;
}

Assistant:

bool JsrtDebuggerStackFrame::Evaluate(Js::ScriptContext* scriptContext, const char16 *source, int sourceLength, bool isLibraryCode, bool forceSetValueProp, Js::DynamicObject** evalResult)
{
    *evalResult = nullptr;
    bool success = false;
    if (this->stackFrame != nullptr)
    {
        Js::ResolvedObject resolvedObject;
        HRESULT hr = S_OK;
        Js::ScriptContext* frameScriptContext = this->stackFrame->GetScriptContext();

        Js::JavascriptExceptionObject *exceptionObject = nullptr;
        {
            BEGIN_JS_RUNTIME_CALL_EX_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED(frameScriptContext, false)
            {
                ENFORCE_ENTRYEXITRECORD_HASCALLER(frameScriptContext);
                this->stackFrame->EvaluateImmediate(source, sourceLength, isLibraryCode, &resolvedObject);
            }
            END_JS_RUNTIME_CALL_AND_TRANSLATE_AND_GET_EXCEPTION_AND_ERROROBJECT_TO_HRESULT(hr, frameScriptContext, exceptionObject);
        }

        if (resolvedObject.obj == nullptr)
        {
            resolvedObject.name = _u("{exception}");
            resolvedObject.typeId = Js::TypeIds_Error;
            resolvedObject.address = nullptr;

            if (exceptionObject != nullptr)
            {
                resolvedObject.obj = exceptionObject->GetThrownObject(scriptContext);
            }
            else
            {
                resolvedObject.obj = scriptContext->GetLibrary()->GetUndefined();
            }
        }
        else
        {
          success = true;
        }

        if (resolvedObject.obj != nullptr)
        {
            resolvedObject.scriptContext = frameScriptContext;

            charcount_t len = Js::JavascriptString::GetBufferLength(source);
            resolvedObject.name = AnewNoThrowArray(this->debuggerObjectsManager->GetDebugObjectArena(), WCHAR, len + 1);

            if (resolvedObject.name != nullptr)
            {
                wcscpy_s((WCHAR*)resolvedObject.name, len + 1, source);
            }
            else
            {
                // len can be big, if we failed just have empty string
                resolvedObject.name = _u("");
            }

            resolvedObject.typeId = Js::JavascriptOperators::GetTypeId(resolvedObject.obj);
            JsrtDebuggerObjectBase::CreateDebuggerObject<JsrtDebuggerObjectProperty>(this->debuggerObjectsManager, resolvedObject, scriptContext, forceSetValueProp, [&](Js::Var marshaledObj)
            {
                *evalResult = (Js::DynamicObject*)marshaledObj;
            });
        }
    }
    return success;
}